

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O3

void __thiscall
AuthGameCommand::trigger
          (AuthGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  _List_node_base *p_Var1;
  int iVar2;
  PlayerInfo *pPVar3;
  undefined8 *puVar4;
  _List_node_base *__n;
  char *pcVar5;
  undefined8 uVar6;
  void *__s1;
  string_view uuid;
  
  if (parameters._M_len == 0) {
    pcVar5 = "Error: Too few parameters. Syntax: auth <player>";
    uVar6 = 0x30;
    goto LAB_00110772;
  }
  pPVar3 = (PlayerInfo *)
           RenX::Server::getPlayerByPartName(source,parameters._M_len,parameters._M_str);
  if (pPVar3 == (PlayerInfo *)0x0) {
    pcVar5 = "Error: Player not found.";
    uVar6 = 0x18;
    goto LAB_00110772;
  }
  if (pPVar3 == player) {
    pcVar5 = "Error: You can not authenticate yourself.";
    uVar6 = 0x29;
    goto LAB_00110772;
  }
  uuid._M_str = (pPVar3->uuid)._M_dataplus._M_p;
  uuid._M_len = (pPVar3->uuid)._M_string_length;
  iVar2 = RenX_ModSystemPlugin::getConfigAccess(&pluginInstance,uuid);
  p_Var1 = pluginInstance.groups.
           super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (player->access < iVar2) {
    pcVar5 = "Error: Can\'t authenticate higher level moderators.";
    uVar6 = 0x32;
    goto LAB_00110772;
  }
  if (pPVar3->access == iVar2) {
    pcVar5 = "Error: Player is already authenticated";
    uVar6 = 0x26;
    goto LAB_00110772;
  }
  if (iVar2 < pPVar3->access) {
    pcVar5 = "Error: Player is already temporarily authenticated.";
    uVar6 = 0x33;
    goto LAB_00110772;
  }
  iVar2 = RenX_ModSystemPlugin::auth(&pluginInstance,source,player,false,false);
  if (iVar2 == -1) {
    pcVar5 = "Error: Player failed to pass strict lock checks. Player kicked.";
    uVar6 = 0x3f;
    goto LAB_00110772;
  }
  puVar4 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
  uVar6 = Jupiter::Config::operator[](&player->varData,puVar4[1],*puVar4);
  __n = (_List_node_base *)Jupiter::Config::get(uVar6,5,"Group",0,0);
  if (__n == p_Var1[6]._M_prev) {
    if (__n != (_List_node_base *)0x0) {
      iVar2 = bcmp(__s1,p_Var1[6]._M_next,(size_t)__n);
      if (iVar2 != 0) goto LAB_0011074a;
    }
    pcVar5 = "Error: Failed to authenticate player.";
    uVar6 = 0x25;
  }
  else {
LAB_0011074a:
    pcVar5 = "Player authenticated successfully.";
    uVar6 = 0x22;
  }
LAB_00110772:
  RenX::Server::sendMessage(source,player,uVar6,pcVar5);
  return;
}

Assistant:

void AuthGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters)
{
	if (!parameters.empty())
	{
		RenX::PlayerInfo *target = source->getPlayerByPartName(parameters);
		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (target == player)
			source->sendMessage(*player, "Error: You can not authenticate yourself."sv);
		else
		{
			int cAccess = pluginInstance.getConfigAccess(target->uuid);
			if (cAccess > player->access)
				source->sendMessage(*player, "Error: Can't authenticate higher level moderators."sv);
			else if (target->access == cAccess)
				source->sendMessage(*player, "Error: Player is already authenticated"sv);
			else if (target->access > cAccess)
				source->sendMessage(*player, "Error: Player is already temporarily authenticated."sv);
			else
			{
				RenX_ModSystemPlugin::ModGroup *defaultGroup = pluginInstance.getDefaultGroup();
				if (pluginInstance.auth(*source, *player) == -1)
					source->sendMessage(*player, "Error: Player failed to pass strict lock checks. Player kicked."sv);
				else if (defaultGroup->name == player->varData[pluginInstance.getName()].get("Group"sv))
					source->sendMessage(*player, "Error: Failed to authenticate player."sv);
				else
					source->sendMessage(*player, "Player authenticated successfully."sv);
			}
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: auth <player>"sv);
}